

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

void yv12_tile_copy(YV12_BUFFER_CONFIG *src,int hstart1,int hend1,int vstart1,int vend1,
                   YV12_BUFFER_CONFIG *dst,int hstart2,int vstart2,int plane)

{
  int iVar1;
  int local_48;
  uint8_t *dst8;
  uint16_t *src16;
  int col;
  int row;
  int dst_stride;
  int src_stride;
  YV12_BUFFER_CONFIG *dst_local;
  int vend1_local;
  int vstart1_local;
  int hend1_local;
  int hstart1_local;
  YV12_BUFFER_CONFIG *src_local;
  
  if (plane < 1) {
    iVar1 = (src->field_4).field_0.y_stride;
    local_48 = (dst->field_4).field_0.y_stride;
  }
  else {
    iVar1 = (src->field_4).field_0.uv_stride;
    local_48 = (dst->field_4).field_0.uv_stride;
  }
  src16 = (uint16_t *)
          ((long)(src->store_buf_adr[(long)plane + -4] + (long)hstart1 + (long)(vstart1 * iVar1)) *
          2);
  dst8 = dst->store_buf_adr[(long)plane + -4] + (long)hstart2 + (long)(vstart2 * local_48);
  for (row = vstart1; row < vend1; row = row + 1) {
    for (col = 0; col < hend1 - hstart1; col = col + 1) {
      *dst8 = (uint8_t)*src16;
      dst8 = dst8 + 1;
      src16 = src16 + 1;
    }
    src16 = src16 + (iVar1 - (hend1 - hstart1));
    dst8 = dst8 + (local_48 - (hend1 - hstart1));
  }
  return;
}

Assistant:

static void yv12_tile_copy(const YV12_BUFFER_CONFIG *src, int hstart1,
                           int hend1, int vstart1, int vend1,
                           YV12_BUFFER_CONFIG *dst, int hstart2, int vstart2,
                           int plane) {
  const int src_stride = (plane > 0) ? src->strides[1] : src->strides[0];
  const int dst_stride = (plane > 0) ? dst->strides[1] : dst->strides[0];
  int row, col;

  assert(src->flags & YV12_FLAG_HIGHBITDEPTH);
  assert(!(dst->flags & YV12_FLAG_HIGHBITDEPTH));

  const uint16_t *src16 =
      CONVERT_TO_SHORTPTR(src->buffers[plane] + vstart1 * src_stride + hstart1);
  uint8_t *dst8 = dst->buffers[plane] + vstart2 * dst_stride + hstart2;

  for (row = vstart1; row < vend1; ++row) {
    for (col = 0; col < (hend1 - hstart1); ++col) *dst8++ = (uint8_t)(*src16++);
    src16 += src_stride - (hend1 - hstart1);
    dst8 += dst_stride - (hend1 - hstart1);
  }
  return;
}